

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  rep rVar8;
  ulong uVar9;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
  *in_stack_fffffffffffffa00;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
  *in_stack_fffffffffffffa08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffa10;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *this;
  size_t in_stack_fffffffffffffa20;
  ulong *puVar10;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
  *in_stack_fffffffffffffa28;
  ulong *puVar11;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffa30;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_>
  *in_stack_fffffffffffffa38;
  ulong *puVar12;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_ptr_Sequence_ptr
  *in_stack_fffffffffffffa40;
  thread *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa60;
  ulong *local_498;
  ulong *local_468;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_438;
  duration<long,_std::ratio<1L,_1000L>_> local_410;
  duration<long,_std::ratio<1L,_1000L>_> local_408;
  string local_400 [32];
  string local_3e0 [32];
  rep local_3c0;
  undefined8 local_3b8;
  int64_t local_3b0;
  int local_3a8;
  int local_3a4;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> *local_3a0;
  int local_38c;
  undefined8 local_388;
  ulong *local_380;
  Sequence *local_378;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> *local_370;
  int local_35c;
  ulong *local_358;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_350;
  int local_344;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_90;
  __atomic_base<long> local_88;
  memory_order local_80;
  undefined4 local_7c;
  atomic<long> *local_78;
  __int_type local_70;
  memory_order local_68;
  int local_64;
  __atomic_base<long> local_60;
  atomic<long> *local_58;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_58 = &sum;
  local_60._M_i = 0;
  local_64 = 5;
  local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_70 = local_60._M_i;
  if ((local_64 != 3) && (local_64 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_60._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_90 = (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             operator_new__(uVar6);
  if (uVar5 != 0) {
    local_438 = local_90;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffa08,(int64_t)in_stack_fffffffffffffa00);
      local_438 = local_438 + 5;
    } while (local_438 != local_90 + uVar5 * 5);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x168ade);
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
  Sequencer(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  for (local_344 = 0; local_344 < nc; local_344 = local_344 + 1) {
    local_350 = local_90 + (long)local_344 * 5;
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffa08,(value_type *)in_stack_fffffffffffffa00);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
  set_gating_sequences
            (in_stack_fffffffffffffa08,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffa00);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_358 = (ulong *)operator_new__(uVar9);
  *local_358 = uVar5;
  local_358 = local_358 + 1;
  if (uVar5 != 0) {
    local_468 = local_358;
    do {
      std::thread::thread((thread *)0x168c71);
      local_468 = local_468 + 1;
    } while (local_468 != local_358 + uVar5);
  }
  for (local_35c = 0; local_35c < nc; local_35c = local_35c + 1) {
    local_370 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>
                             (in_stack_fffffffffffffa00);
    local_378 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffa00);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30);
    std::thread::operator=((thread *)in_stack_fffffffffffffa08,(thread *)in_stack_fffffffffffffa00);
    std::thread::~thread((thread *)0x168d50);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_380 = (ulong *)operator_new__(uVar9);
  *local_380 = uVar5;
  local_380 = local_380 + 1;
  if (uVar5 != 0) {
    local_498 = local_380;
    do {
      std::thread::thread((thread *)0x168e0b);
      local_498 = local_498 + 1;
    } while (local_498 != local_380 + uVar5);
  }
  local_388 = std::chrono::_V2::system_clock::now();
  for (local_38c = 0; local_38c < np; local_38c = local_38c + 1) {
    local_3a0 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>
                             (in_stack_fffffffffffffa00);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,void>
              (in_stack_fffffffffffffa48,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_ptr
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    std::thread::operator=((thread *)in_stack_fffffffffffffa08,(thread *)in_stack_fffffffffffffa00);
    std::thread::~thread((thread *)0x168ec7);
  }
  for (local_3a4 = 0; local_3a4 < np; local_3a4 = local_3a4 + 1) {
    std::thread::join();
  }
  for (local_3a8 = 0; local_3a8 < nc; local_3a8 = local_3a8 + 1) {
    std::thread::join();
  }
  local_3b0 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
              GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>
                         *)0x168f7e);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  poVar4 = std::operator<<(poVar4," Alignment: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3b0);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_78 = &sum;
  local_7c = 5;
  local_80 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_88 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_3b8 = std::chrono::_V2::system_clock::now();
  local_3c0 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffa10,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffa08);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffa60);
  poVar4 = std::operator<<(poVar4,local_3e0);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name((type_info *)&disruptor::BlockingStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffa60);
  poVar4 = std::operator<<(poVar4,local_400);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_3e0);
  lVar7 = local_3b0 * 1000;
  local_408.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa00);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_408);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar7 / rVar8);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Milliseconds: ");
  local_410.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa00);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_410);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar8);
  std::operator<<(poVar4,"\n\n");
  puVar12 = local_358;
  if (local_358 != (ulong *)0x0) {
    puVar11 = local_358 + -1;
    puVar10 = local_358 + local_358[-1];
    while (puVar12 != puVar10) {
      puVar10 = puVar10 + -1;
      std::thread::~thread((thread *)0x1694f0);
    }
    operator_delete__(puVar11);
  }
  if (local_380 != (ulong *)0x0) {
    puVar11 = local_380 + -1;
    puVar10 = local_380 + local_380[-1];
    puVar12 = local_380;
    if (local_380 != puVar10) {
      do {
        puVar10 = puVar10 + -1;
        std::thread::~thread((thread *)0x16955d);
      } while (puVar10 != puVar12);
    }
    operator_delete__(puVar11);
  }
  this = local_90;
  if (local_90 != (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x0) {
    operator_delete__(local_90);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
  ~Sequencer(in_stack_fffffffffffffa08);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(this);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}